

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

int __thiscall
flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>::clone
          (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  _Alloc_hider local_20;
  Value *local_18;
  
  local_20._M_p = (pointer)**(undefined8 **)(__fn + 0x50);
  std::
  make_unique<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*,std::__cxx11::string_const&>
            (&local_18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<UnaryInstr<Operator, ResultType>>(operand(0), name());
  }